

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marketgenerator.cpp
# Opt level: O0

queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
* __thiscall
hedg::MarketGenerator::markets_abi_cxx11_
          (queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
           *__return_storage_ptr__,MarketGenerator *this)

{
  bool bVar1;
  reference __x;
  MarketGenerator *this_local;
  queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
  *temp;
  
  wait_for_gen(this);
  std::
  queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
  ::
  queue<std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>,void>
            ((queue<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::deque<std::pair<std::__cxx11::string,hedg::Market_Projection>,std::allocator<std::pair<std::__cxx11::string,hedg::Market_Projection>>>>
              *)__return_storage_ptr__);
  while (bVar1 = std::
                 queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
                 ::empty(&this->markets_), ((bVar1 ^ 0xffU) & 1) != 0) {
    __x = std::
          queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
          ::front(&this->markets_);
    std::
    queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
    ::push(__return_storage_ptr__,__x);
    std::
    queue<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::deque<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_hedg::Market_Projection>_>_>_>
    ::pop(&this->markets_);
  }
  return __return_storage_ptr__;
}

Assistant:

std::queue<std::pair<std::string, Market_Projection> > MarketGenerator::markets() {

	wait_for_gen();
	std::queue<std::pair<std::string, Market_Projection> > temp;
	while (!markets_.empty()) {
		temp.push(markets_.front());
		markets_.pop();
	}
	return temp;
}